

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

NULLCAutoArray * __thiscall
NULLCTypeInfo::GetArrayByName
          (NULLCAutoArray *__return_storage_ptr__,NULLCTypeInfo *this,NULLCArray name,uint size)

{
  TypeID typeID;
  NULLCArray NVar1;
  char *local_68;
  NULLCArray arr;
  TypeID id;
  uint size_local;
  NULLCArray name_local;
  
  memset(__return_storage_ptr__,0,0x10);
  NVar1.len = (uint)name.ptr;
  NVar1.ptr = (char *)this;
  typeID = GetType(NVar1);
  if (typeID.typeID != 0) {
    NVar1 = nullcAllocateArrayTyped(typeID.typeID,name.len);
    local_68 = NVar1.ptr;
    __return_storage_ptr__->len = name.len;
    __return_storage_ptr__->typeID = typeID.typeID;
    __return_storage_ptr__->ptr = local_68;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCAutoArray GetArrayByName(NULLCArray name, unsigned size)
	{
		NULLCAutoArray r = { 0, 0, 0 };

		TypeID id = GetType(name);
		if(!id.typeID)
			return r;

		NULLCArray arr = nullcAllocateArrayTyped(id.typeID, size);
		r.len = size;
		r.typeID = id.typeID;
		r.ptr = arr.ptr;
		return r;
	}